

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGhsMultiGenerator::ComputeObjectFilenames
          (cmLocalGhsMultiGenerator *this,
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *mapping,cmGeneratorTarget *gt)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  cmSourceFile *pcVar3;
  string *psVar4;
  mapped_type_conflict *pmVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  string objectNameLower;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  counts;
  bool keptSourceExtension;
  string dir_max;
  string local_100;
  string local_e0;
  undefined1 local_c0 [32];
  _Base_ptr local_a0;
  size_t local_98;
  string local_90;
  string local_70;
  string local_50;
  
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(&this->super_cmLocalGenerator);
  local_e0._M_dataplus._M_p._0_1_ = 0x2f;
  (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[0x10])
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,this,gt);
  local_100._M_dataplus._M_p._0_1_ = 0x2f;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char>
            (&local_70,psVar4,(char *)&local_e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
             (char *)&local_100);
  std::__cxx11::string::~string((string *)local_c0);
  local_c0._24_8_ = local_c0 + 8;
  local_c0._8_4_ = _S_red;
  local_c0._16_8_ = 0;
  local_98 = 0;
  p_Var1 = &(mapping->_M_t)._M_impl.super__Rb_tree_header;
  local_a0 = (_Base_ptr)local_c0._24_8_;
  for (p_Var6 = (mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    pcVar3 = *(cmSourceFile **)(p_Var6 + 1);
    psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar3);
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_90,psVar4);
    cmsys::SystemTools::LowerCase(&local_100,&local_90);
    cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
              (&local_50,(this->super_cmLocalGenerator).GlobalGenerator,pcVar3);
    cmStrCat<std::__cxx11::string,std::__cxx11::string>(&local_e0,&local_100,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_90);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)local_c0,&local_e0);
    *pmVar5 = *pmVar5 + 1;
    std::__cxx11::string::~string((string *)&local_e0);
  }
  for (p_Var7 = (mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    pcVar3 = *(cmSourceFile **)(p_Var7 + 1);
    psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar3);
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_100,psVar4);
    cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
              (&local_90,(this->super_cmLocalGenerator).GlobalGenerator,pcVar3);
    cmStrCat<std::__cxx11::string,std::__cxx11::string>(&local_e0,&local_100,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_100);
    cmsys::SystemTools::LowerCase(&local_100,&local_e0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)local_c0,&local_100);
    iVar2 = *pmVar5;
    std::__cxx11::string::~string((string *)&local_100);
    if (1 < iVar2) {
      cmGeneratorTarget::AddExplicitObjectName(gt,pcVar3);
      cmLocalGenerator::GetObjectFileNameWithoutTarget
                (&local_100,&this->super_cmLocalGenerator,pcVar3,&local_70,(bool *)&local_90,
                 (char *)0x0);
      std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      cmsys::SystemTools::ReplaceString(&local_e0,"/","_");
    }
    std::__cxx11::string::_M_assign((string *)&p_Var7[1]._M_parent);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_c0);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void cmLocalGhsMultiGenerator::ComputeObjectFilenames(
  std::map<cmSourceFile const*, std::string>& mapping,
  cmGeneratorTarget const* gt)
{
  std::string dir_max = cmStrCat(this->GetCurrentBinaryDirectory(), '/',
                                 this->GetTargetDirectory(gt), '/');

  // Count the number of object files with each name.  Note that
  // filesystem may not be case sensitive.
  std::map<std::string, int> counts;

  for (auto const& si : mapping) {
    cmSourceFile const* sf = si.first;
    std::string objectNameLower = cmStrCat(
      cmSystemTools::LowerCase(
        cmSystemTools::GetFilenameWithoutLastExtension(sf->GetFullPath())),
      this->GlobalGenerator->GetLanguageOutputExtension(*sf));
    counts[objectNameLower] += 1;
  }

  // For all source files producing duplicate names we need unique
  // object name computation.
  for (auto& si : mapping) {
    cmSourceFile const* sf = si.first;
    std::string objectName = cmStrCat(
      cmSystemTools::GetFilenameWithoutLastExtension(sf->GetFullPath()),
      this->GlobalGenerator->GetLanguageOutputExtension(*sf));

    if (counts[cmSystemTools::LowerCase(objectName)] > 1) {
      const_cast<cmGeneratorTarget*>(gt)->AddExplicitObjectName(sf);
      bool keptSourceExtension;
      objectName = this->GetObjectFileNameWithoutTarget(*sf, dir_max,
                                                        &keptSourceExtension);
      cmsys::SystemTools::ReplaceString(objectName, "/", "_");
    }
    si.second = objectName;
  }
}